

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O3

Index wasm::Properties::getSignExtBits(Expression *curr)

{
  Index IVar1;
  uint uVar2;
  char *pcVar3;
  
  if ((curr->type).id != 2) {
    __assert_fail("curr->type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/properties.h"
                  ,0xb3,"Index wasm::Properties::getSignExtBits(Expression *)");
  }
  if (curr->_id == BinaryId) {
    pcVar3 = *(char **)(curr + 2);
    if (*pcVar3 != '\x0e') {
      pcVar3 = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_009ce858;
    }
    if (*(long *)(pcVar3 + 8) == 3) {
      if (*(long *)(pcVar3 + 0x20) != 3) {
        __assert_fail("type == Type::i64",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                      ,0x129,"int64_t wasm::Literal::geti64() const");
      }
      uVar2 = *(uint *)(pcVar3 + 0x10) & 0x3f;
    }
    else {
      if (*(long *)(pcVar3 + 8) != 2) {
        handle_unreachable("unexpected type",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                           ,0x4a);
      }
      if (*(long *)(pcVar3 + 0x20) != 2) {
        __assert_fail("type == Type::i32",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                      ,0x120,"int32_t wasm::Literal::geti32() const");
      }
      uVar2 = *(uint *)(pcVar3 + 0x10) & 0x1f;
    }
    IVar1 = 0x20 - uVar2;
  }
  else {
    if (curr->_id != UnaryId) {
      pcVar3 = "T *wasm::Expression::cast() [T = wasm::Binary]";
LAB_009ce858:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                    ,0x31b,pcVar3);
    }
    IVar1 = 8;
    if (*(int *)(curr + 1) != 0x2f) {
      if (*(int *)(curr + 1) != 0x30) {
        handle_unreachable("invalid unary operation",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/properties.h"
                           ,0xbb);
      }
      IVar1 = 0x10;
    }
  }
  return IVar1;
}

Assistant:

inline Index getSignExtBits(Expression* curr) {
  assert(curr->type == Type::i32);
  if (auto* unary = curr->dynCast<Unary>()) {
    switch (unary->op) {
      case ExtendS8Int32:
        return 8;
      case ExtendS16Int32:
        return 16;
      default:
        WASM_UNREACHABLE("invalid unary operation");
    }
  } else {
    auto* rightShift = curr->cast<Binary>()->right;
    return 32 - Bits::getEffectiveShifts(rightShift);
  }
}